

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O0

void createmetatable(lua_State *L)

{
  lua_State *L_local;
  
  lua_createtable(L,0,1);
  lua_pushstring(L,"");
  lua_pushvalue(L,-2);
  lua_setmetatable(L,-2);
  lua_settop(L,-2);
  lua_pushvalue(L,-2);
  lua_setfield(L,-2,"__index");
  lua_settop(L,-2);
  return;
}

Assistant:

static void createmetatable(lua_State *L) {
    lua_createtable(L, 0, 1);  /* table to be metatable for strings */
    lua_pushliteral(L, "");  /* dummy string */
    lua_pushvalue(L, -2);  /* copy table */
    lua_setmetatable(L, -2);  /* set table as metatable for strings */
    lua_pop(L, 1);  /* pop dummy string */
    lua_pushvalue(L, -2);  /* get string library */
    lua_setfield(L, -2, "__index");  /* metatable.__index = string */
    lua_pop(L, 1);  /* pop metatable */
}